

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  uchar *puVar6;
  long lVar7;
  ImFont *pIVar8;
  bool bVar9;
  ImFontAtlasCustomRect *pIVar10;
  int iVar11;
  ImVec4 *pIVar12;
  ulong uVar13;
  int iVar14;
  uchar *__s;
  ulong __n;
  bool bVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  float fVar19;
  ImVec2 local_68;
  ImVec2 local_60;
  int local_58;
  uint local_54;
  ulong local_50;
  ImFontAtlasCustomRect *local_48;
  ulong local_40;
  ImVec4 *local_38;
  ulong __n_00;
  
  if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                  ,0x9a8,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar10 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar10->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                  ,0x95a,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar10->Width != 0xd9) || (pIVar10->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0x960,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    ImFontAtlasBuildRender1bppRectFromString
              (atlas,(uint)uVar3,(uint)pIVar10->Y,0x6c,0x1b,
               "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
               ,'.',0xff);
    ImFontAtlasBuildRender1bppRectFromString
              (atlas,uVar3 + 0x6d,(uint)pIVar10->Y,0x6c,0x1b,
               "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
               ,'X',0xff);
  }
  else {
    if ((pIVar10->Width != 2) || (pIVar10->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0x969,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar11 = (uint)pIVar10->Y * atlas->TexWidth + (uint)uVar3;
    lVar17 = (long)(atlas->TexWidth + iVar11);
    atlas->TexPixelsAlpha8[lVar17 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar17] = 0xff;
    atlas->TexPixelsAlpha8[(long)iVar11 + 1] = 0xff;
    atlas->TexPixelsAlpha8[iVar11] = 0xff;
  }
  uVar16._0_2_ = pIVar10->X;
  uVar16._2_2_ = pIVar10->Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar16 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar16 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    local_48 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar3 = local_48->X;
    if (uVar3 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                    ,0x977,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    pIVar12 = atlas->TexUvLines;
    local_50 = 0;
    uVar13 = 0;
    __n = 0;
    do {
      local_38 = pIVar12;
      if (local_48->Height <= __n) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                      ,0x981,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar4 = local_48->Width;
      uVar16 = (int)uVar13 + (uint)uVar4 >> 1;
      __n_00 = (ulong)uVar16;
      puVar6 = atlas->TexPixelsAlpha8;
      uVar5 = local_48->Y;
      iVar11 = (int)__n;
      local_58 = atlas->TexWidth;
      __s = puVar6 + ((iVar11 + (uint)uVar5) * local_58 + (uint)uVar3);
      local_54 = (uint)uVar3;
      local_40 = uVar13;
      memset(__s,0,__n_00);
      memset(__s + __n_00,0xff,__n);
      iVar14 = (int)local_50;
      memset(puVar6 + (ulong)(((uint)uVar5 + iVar14) * local_58 + local_54) + __n + __n_00,0,
             (ulong)((uVar4 - uVar16) + (int)uVar13));
      uVar3 = local_48->X;
      uVar4 = local_48->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar19 = (atlas->TexUvScale).y;
      __n = __n + 1;
      local_38->x = (float)((uVar16 + uVar3) - 1) * fVar1;
      fVar19 = ((float)(int)((uint)uVar4 + iVar11 + 1) * fVar19 +
               (float)(int)(iVar11 + (uint)uVar4) * fVar19) * 0.5;
      local_38->y = fVar19;
      local_38->z = fVar1 * (float)(uVar16 + uVar3 + iVar11 + 1);
      local_38->w = fVar19;
      pIVar12 = local_38 + 1;
      uVar13 = (ulong)((int)local_40 - 1);
      local_50 = (ulong)(iVar14 + 1);
    } while (__n != 0x40);
  }
  iVar11 = (atlas->CustomRects).Size;
  if (0 < iVar11) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      pIVar10 = (atlas->CustomRects).Data;
      lVar7 = *(long *)((long)&pIVar10->Font + lVar17);
      if ((lVar7 != 0) && (*(int *)((long)&pIVar10->GlyphID + lVar17) != 0)) {
        if (*(ImFontAtlas **)(lVar7 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_draw.cpp"
                        ,0x9b4,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_60.x = 0.0;
        local_60.y = 0.0;
        local_68.x = 0.0;
        local_68.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar10->Width + lVar17),&local_60,
                   &local_68);
        fVar1 = *(float *)((long)&(pIVar10->GlyphOffset).x + lVar17);
        fVar19 = *(float *)((long)&(pIVar10->GlyphOffset).y + lVar17);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar10->Font + lVar17),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar10->GlyphID + lVar17),fVar1,fVar19,
                         (float)*(ushort *)((long)&pIVar10->Width + lVar17) + fVar1,
                         (float)*(ushort *)((long)&pIVar10->Height + lVar17) + fVar19,local_60.x,
                         local_60.y,local_68.x,local_68.y,
                         *(float *)((long)&pIVar10->GlyphAdvanceX + lVar17));
        iVar11 = (atlas->CustomRects).Size;
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar18 < iVar11);
  }
  uVar16 = (atlas->Fonts).Size;
  if (0 < (int)uVar16) {
    lVar17 = 0;
    do {
      pIVar8 = (atlas->Fonts).Data[lVar17];
      if (pIVar8->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar8);
        uVar16 = (atlas->Fonts).Size;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (int)uVar16);
    if (0 < (int)uVar16) {
      uVar13 = 0;
      do {
        if ((long)(atlas->Fonts).Size <= (long)uVar13) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                        ,0x644,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
        }
        pIVar8 = (atlas->Fonts).Data[uVar13];
        if (pIVar8->EllipsisChar == 0xffff) {
          lVar17 = 0;
          bVar9 = true;
          do {
            bVar15 = bVar9;
            uVar3 = (&DAT_001e4538)[lVar17];
            if ((((ulong)uVar3 < (ulong)(long)(pIVar8->IndexLookup).Size) &&
                ((pIVar8->IndexLookup).Data[uVar3] != 0xffff)) &&
               ((pIVar8->Glyphs).Data != (ImFontGlyph *)0x0)) {
              pIVar8->EllipsisChar = uVar3;
              break;
            }
            lVar17 = 1;
            bVar9 = false;
          } while (bVar15);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar16);
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}